

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O2

void __thiscall
CoreML::TreeEnsembleClassifier::TreeEnsembleClassifier
          (TreeEnsembleClassifier *this,string *predictedClassOutputName,
          string *classProbabilityOutputName,string *description)

{
  ulong uVar1;
  TreeEnsembleClassifier *pTVar2;
  ModelDescription *pMVar3;
  undefined8 *puVar4;
  Model MStack_38;
  
  Model::Model(&MStack_38,description);
  TreeEnsembleBase::TreeEnsembleBase(&this->super_TreeEnsembleBase,&MStack_38,true);
  Model::~Model(&MStack_38);
  (this->super_TreeEnsembleBase).super_Model._vptr_Model =
       (_func_int **)&PTR__TreeEnsembleRegressor_00405258;
  pTVar2 = Specification::Model::_internal_mutable_treeensembleclassifier
                     ((this->super_TreeEnsembleBase).super_Model.m_spec.
                      super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  this->tree_classifier_parameters = pTVar2;
  pMVar3 = Specification::Model::_internal_mutable_description
                     ((this->super_TreeEnsembleBase).super_Model.m_spec.
                      super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  uVar1 = (pMVar3->super_MessageLite)._internal_metadata_.ptr_;
  puVar4 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar4 = (undefined8 *)*puVar4;
  }
  google::protobuf::internal::ArenaStringPtr::Set
            (&pMVar3->predictedfeaturename_,predictedClassOutputName,puVar4);
  pMVar3 = Specification::Model::_internal_mutable_description
                     ((this->super_TreeEnsembleBase).super_Model.m_spec.
                      super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  uVar1 = (pMVar3->super_MessageLite)._internal_metadata_.ptr_;
  puVar4 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar4 = (undefined8 *)*puVar4;
  }
  google::protobuf::internal::ArenaStringPtr::Set
            (&pMVar3->predictedprobabilitiesname_,classProbabilityOutputName,puVar4);
  return;
}

Assistant:

TreeEnsembleClassifier::TreeEnsembleClassifier
    (const std::string& predictedClassOutputName,
     const std::string& classProbabilityOutputName,
     const std::string& description)
    : TreeEnsembleBase(Model(description), true /* isClassifier */),
      tree_classifier_parameters(m_spec->mutable_treeensembleclassifier())
    {
        m_spec->mutable_description()->set_predictedfeaturename(predictedClassOutputName);
        m_spec->mutable_description()->set_predictedprobabilitiesname(classProbabilityOutputName);
    }